

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O2

void copy<unsigned_char*,unsigned_char**>(vector_brodnik<unsigned_char_*> *bucket,uchar **dst)

{
  pointer pppuVar1;
  pointer pppuVar2;
  byte bVar3;
  size_t __n;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  lVar4 = 8;
  bVar3 = 0;
  uVar8 = 0;
  lVar5 = lVar4;
  while (pppuVar2 = (bucket->_index_block).
                    super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                    super__Vector_impl_data._M_finish,
        uVar8 < (ulong)((long)pppuVar2 -
                        (long)(bucket->_index_block).
                              super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    lVar6 = lVar5;
    uVar7 = uVar8;
    while (bVar9 = lVar6 != 0, lVar6 = lVar6 + -1, bVar9) {
      pppuVar1 = (bucket->_index_block).
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pppuVar2 = (bucket->_index_block).
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (uVar7 == ((long)pppuVar2 - (long)pppuVar1 >> 3) - 1U) goto LAB_001fa0a1;
      if (lVar4 != 0) {
        memmove(dst,pppuVar1[uVar7],lVar4 * 8);
      }
      dst = dst + lVar4;
      uVar7 = uVar7 + 1;
    }
    lVar6 = lVar5 << bVar3;
    bVar3 = bVar3 ^ 1;
    lVar4 = lVar4 << bVar3;
    uVar8 = uVar8 + lVar5;
    lVar5 = lVar6;
  }
LAB_001fa0a1:
  __n = (long)bucket->_insertpos - (long)pppuVar2[-1];
  if (__n != 0) {
    memmove(dst,pppuVar2[-1],__n);
    return;
  }
  return;
}

Assistant:

static inline void
copy(const vector_brodnik<T>& bucket, OutputIterator dst)
{
	bool superblock_odd=(vector_brodnik<T>::InitialSuperBlock % 2 == 1);
	size_t superblocksize=vector_brodnik<T>::InitialSuperBlocksize;
	size_t blocksize=vector_brodnik<T>::InitialBlocksize;
	for (size_t i=0; i < bucket._index_block.size(); ) {
		for (size_t j=0; j < superblocksize; ++j) {
			if (i+j == (bucket._index_block.size()-1)) goto done;
			std::copy(bucket._index_block[i+j],
			          bucket._index_block[i+j]+blocksize,
			          dst);
			dst += blocksize;
		}
		i += superblocksize;
		superblocksize <<= superblock_odd;
		blocksize     <<= !superblock_odd;
		superblock_odd = !superblock_odd;
	}
done:
	std::copy(bucket._index_block.back(),
	          bucket._insertpos,
	          dst);
}